

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O3

void __thiscall
bssl::ParseNameTest_ConvertBmpString_Test::TestBody(ParseNameTest_ConvertBmpString_Test *this)

{
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  string result;
  string result_unsafe;
  uint8_t der [12];
  AssertHelper local_d8;
  AssertHelper local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  AssertHelper local_80;
  string local_78;
  uchar local_58 [16];
  X509NameAttribute local_48;
  
  local_48.value.data_.data_ = local_58;
  local_58[0] = '\0';
  local_58[1] = 'f';
  local_58[2] = '\0';
  local_58[3] = 'o';
  local_58[4] = '\0';
  local_58[5] = 'o';
  local_58[6] = '\0';
  local_58[7] = 'b';
  local_58[8] = '\0';
  local_58[9] = 'a';
  local_58[10] = '\0';
  local_58[0xb] = 'r';
  local_48.type.data_.data_ = (uchar *)0x0;
  local_48.type.data_.size_ = 0;
  local_48.value_tag = 0x1e;
  local_48.value.data_.size_ = 0xc;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_c0[0] = (internal)X509NameAttribute::ValueAsStringUnsafe(&local_48,&local_78);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_c0[0]) {
    testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
              ((internal *)local_a0,"\"foobar\"","result_unsafe",(char (*) [7])"foobar",&local_78);
    if (local_a0[0] != (internal)0x0) {
      if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,local_98);
      }
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_90._M_local_buf[0] = '\0';
      local_a0 = (undefined1  [8])&local_90;
      local_d0.data_._0_1_ =
           (internal)X509NameAttribute::ValueAsString(&local_48,(string *)local_a0);
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_d0.data_._0_1_) {
        testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
                  ((internal *)local_c0,"\"foobar\"","result",(char (*) [7])"foobar",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_d0);
          if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_b8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                     ,0x93,pcVar3);
          testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_d8);
          if ((long *)CONCAT71(local_d0.data_._1_7_,local_d0.data_._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_d0.data_._1_7_,local_d0.data_._0_1_) + 8))();
          }
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8;
          pbVar1 = local_b8;
LAB_0027c596:
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar2,pbVar1);
        }
      }
      else {
        pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8;
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c0,(internal *)&local_d0,
                   (AssertionResult *)"value.ValueAsString(&result)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                   ,0x92,(char *)CONCAT71(local_c0._1_7_,local_c0[0]));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_c0._1_7_,local_c0[0]) != &local_b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_c0._1_7_,local_c0[0]),local_b0._M_allocated_capacity + 1
                         );
        }
        if (local_d8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_d8.data_ + 8))();
        }
        pbVar1 = local_c8;
        if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_0027c596;
      }
      if (local_a0 != (undefined1  [8])&local_90) {
        operator_delete((void *)local_a0,
                        CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1)
        ;
      }
      goto LAB_0027c5b2;
    }
    testing::Message::Message((Message *)local_c0);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)CONCAT71(local_c0._1_7_,local_c0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c0._1_7_,local_c0[0]) + 8))();
    }
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0027c5b2;
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_98;
    pbVar1 = local_98;
  }
  else {
    testing::Message::Message((Message *)&local_d0);
    pdVar2 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_b8;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_c0,
               (AssertionResult *)"value.ValueAsStringUnsafe(&result_unsafe)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x8f,(char *)local_a0);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_a0 != (undefined1  [8])&local_90) {
      operator_delete((void *)local_a0,
                      CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
    }
    if ((long *)CONCAT71(local_d0.data_._1_7_,local_d0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d0.data_._1_7_,local_d0.data_._0_1_) + 8))();
    }
    pbVar1 = local_b8;
    if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0027c5b2;
  }
  ::std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar2,pbVar1);
LAB_0027c5b2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST(ParseNameTest, ConvertBmpString) {
  const uint8_t der[] = {
      0x00, 0x66, 0x00, 0x6f, 0x00, 0x6f, 0x00, 0x62, 0x00, 0x61, 0x00, 0x72,
  };
  X509NameAttribute value(der::Input(), CBS_ASN1_BMPSTRING, der::Input(der));
  std::string result_unsafe;
  ASSERT_TRUE(value.ValueAsStringUnsafe(&result_unsafe));
  ASSERT_EQ("foobar", result_unsafe);
  std::string result;
  ASSERT_TRUE(value.ValueAsString(&result));
  ASSERT_EQ("foobar", result);
}